

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

long * resolve_char(uchar c,bool do_aa,bool ignore_ambigs)

{
  bool ignore_ambigs_local;
  bool do_aa_local;
  uchar c_local;
  long (*local_8) [20];
  
  if (do_aa) {
    if ((ignore_ambigs) && (0x13 < c)) {
      local_8 = resolutions_AA + 0x18;
    }
    else {
      local_8 = resolutions_AA + c;
    }
  }
  else if ((ignore_ambigs) && (3 < c)) {
    local_8 = (long (*) [20])(resolutions + 0x11);
  }
  else {
    local_8 = (long (*) [20])(resolutions + c);
  }
  return *local_8;
}

Assistant:

const long* resolve_char (unsigned char c, bool do_aa, bool ignore_ambigs) {
  
  if (do_aa) {
    if (ignore_ambigs && c >= 20) {
      return resolutions_AA[GAP_AA];
    }
    return resolutions_AA [c];
  } 
  
  if (ignore_ambigs && c >= 4) {
    return resolutions[GAP];
  }
  
  return resolutions [c];
  
}